

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::CharReaderBuilder::validate(CharReaderBuilder *this,Value *invalid)

{
  undefined1 *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  int iVar2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  size_type sVar3;
  reference other;
  Value *this_02;
  const_iterator cVar4;
  bool local_37d;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_320;
  int local_23c;
  undefined1 local_238 [8];
  String key;
  SelfType local_208;
  _Base_ptr local_1f8;
  undefined1 local_1f0;
  undefined1 local_1e8 [8];
  const_iterator si;
  allocator<char> local_1d0;
  allocator<char> local_1cf;
  allocator<char> local_1ce;
  allocator<char> local_1cd;
  allocator<char> local_1cc;
  allocator<char> local_1cb;
  allocator<char> local_1ca;
  allocator<char> local_1c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  iterator local_40;
  size_type local_38;
  Value *local_20;
  Value *invalid_local;
  CharReaderBuilder *this_local;
  
  local_20 = invalid;
  invalid_local = (Value *)this;
  if ((validate(Json::Value*)::valid_keys_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&validate(Json::Value*)::valid_keys_abi_cxx11_), iVar2 != 0)) {
    this_01 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)operator_new(0x30);
    si.super_ValueIteratorBase.isNull_ = true;
    si.super_ValueIteratorBase._11_1_ = 1;
    local_1c8 = &local_1c0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,"collectComments",&local_1c9);
    local_1c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_1a0,"allowComments",&local_1ca);
    local_1c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_180,"allowTrailingCommas",&local_1cb);
    local_1c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_160,"strictRoot",&local_1cc);
    local_1c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_140,"allowDroppedNullPlaceholders",&local_1cd);
    local_1c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_120,"allowNumericKeys",&local_1ce);
    local_1c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_100,"allowSingleQuotes",&local_1cf);
    local_1c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_e0,"stackLimit",&local_1d0);
    local_1c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_c0,"failIfExtra",(allocator<char> *)&si.super_ValueIteratorBase.field_0xf);
    local_1c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_a0,"rejectDupKeys",(allocator<char> *)&si.super_ValueIteratorBase.field_0xe);
    local_1c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_80,"allowSpecialFloats",
               (allocator<char> *)&si.super_ValueIteratorBase.field_0xd);
    local_1c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_60,"skipBom",(allocator<char> *)&si.super_ValueIteratorBase.field_0xc);
    si.super_ValueIteratorBase._11_1_ = 0;
    local_40 = &local_1c0;
    local_38 = 0xc;
    this_00 = &si.super_ValueIteratorBase.field_0x9;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this_00);
    __l._M_len = local_38;
    __l._M_array = local_40;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set(this_01,__l,
          (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
          &si.super_ValueIteratorBase.field_0xa,(allocator_type *)this_00);
    si.super_ValueIteratorBase.isNull_ = false;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&si.super_ValueIteratorBase.field_0x9);
    local_320 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_40;
    do {
      local_320 = local_320 + -1;
      std::__cxx11::string::~string((string *)local_320);
    } while (local_320 != &local_1c0);
    std::allocator<char>::~allocator((allocator<char> *)&si.super_ValueIteratorBase.field_0xc);
    std::allocator<char>::~allocator((allocator<char> *)&si.super_ValueIteratorBase.field_0xd);
    std::allocator<char>::~allocator((allocator<char> *)&si.super_ValueIteratorBase.field_0xe);
    std::allocator<char>::~allocator((allocator<char> *)&si.super_ValueIteratorBase.field_0xf);
    std::allocator<char>::~allocator(&local_1d0);
    std::allocator<char>::~allocator(&local_1cf);
    std::allocator<char>::~allocator(&local_1ce);
    std::allocator<char>::~allocator(&local_1cd);
    std::allocator<char>::~allocator(&local_1cc);
    std::allocator<char>::~allocator(&local_1cb);
    std::allocator<char>::~allocator(&local_1ca);
    std::allocator<char>::~allocator(&local_1c9);
    validate(Json::Value*)::valid_keys_abi_cxx11_ = this_01;
    __cxa_guard_release(&validate(Json::Value*)::valid_keys_abi_cxx11_);
  }
  cVar4 = Value::begin(&this->settings_);
  local_1f8 = (_Base_ptr)cVar4.super_ValueIteratorBase.current_._M_node;
  local_1f0 = cVar4.super_ValueIteratorBase.isNull_;
  local_1e8 = (undefined1  [8])local_1f8;
  si.super_ValueIteratorBase.current_._M_node._0_1_ = local_1f0;
  while( true ) {
    cVar4 = Value::end(&this->settings_);
    key.field_2._8_8_ = cVar4.super_ValueIteratorBase.current_._M_node;
    local_208.isNull_ = cVar4.super_ValueIteratorBase.isNull_;
    local_208.current_._M_node = (_Base_ptr)key.field_2._8_8_;
    bVar1 = ValueIteratorBase::operator!=((ValueIteratorBase *)local_1e8,&local_208);
    if (!bVar1) break;
    ValueIteratorBase::name_abi_cxx11_((String *)local_238,(ValueIteratorBase *)local_1e8);
    sVar3 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(validate(Json::Value*)::valid_keys_abi_cxx11_,(String *)local_238);
    if (sVar3 == 0) {
      if (local_20 == (Value *)0x0) {
        this_local._7_1_ = 0;
        local_23c = 1;
      }
      else {
        other = ValueConstIterator::operator*((ValueConstIterator *)local_1e8);
        this_02 = Value::operator[](local_20,(String *)local_238);
        Value::operator=(this_02,other);
        local_23c = 0;
      }
    }
    else {
      local_23c = 4;
    }
    std::__cxx11::string::~string((string *)local_238);
    if ((local_23c != 0) && (local_23c == 1)) goto LAB_011e6c5c;
    ValueConstIterator::operator++((ValueConstIterator *)local_1e8);
  }
  if (local_20 == (Value *)0x0) {
    local_37d = true;
  }
  else {
    local_37d = Value::empty(local_20);
  }
  this_local._7_1_ = local_37d;
LAB_011e6c5c:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CharReaderBuilder::validate(Json::Value* invalid) const {
  static const auto& valid_keys = *new std::set<String>{
      "collectComments",
      "allowComments",
      "allowTrailingCommas",
      "strictRoot",
      "allowDroppedNullPlaceholders",
      "allowNumericKeys",
      "allowSingleQuotes",
      "stackLimit",
      "failIfExtra",
      "rejectDupKeys",
      "allowSpecialFloats",
      "skipBom",
  };
  for (auto si = settings_.begin(); si != settings_.end(); ++si) {
    auto key = si.name();
    if (valid_keys.count(key))
      continue;
    if (invalid)
      (*invalid)[key] = *si;
    else
      return false;
  }
  return invalid ? invalid->empty() : true;
}